

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::_q_startupNotification(QProcessPrivate *this)

{
  QObject *this_00;
  bool bVar1;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  bVar1 = processStarted(this,(QString *)&local_38);
  if (bVar1) {
    QProcess::setProcessState((QProcess *)this_00,Running);
    QProcess::started((QProcess *)this_00);
  }
  else {
    QProcess::setProcessState((QProcess *)this_00,NotRunning);
    ctx = (EVP_PKEY_CTX *)0x0;
    setErrorAndEmit(this,FailedToStart,(QString *)&local_38);
    waitForDeadChild(this);
    cleanup(this,ctx);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::_q_startupNotification()
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::startupNotification()");
#endif

    QString errorMessage;
    if (processStarted(&errorMessage)) {
        q->setProcessState(QProcess::Running);
        emit q->started(QProcess::QPrivateSignal());
        return true;
    }

    q->setProcessState(QProcess::NotRunning);
    setErrorAndEmit(QProcess::FailedToStart, errorMessage);
#ifdef Q_OS_UNIX
    waitForDeadChild();
#endif
    cleanup();
    return false;
}